

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream *
QtPrivate::readAssociativeContainer<QHash<QString,QVariant>>
          (QDataStream *s,QHash<QString,_QVariant> *c)

{
  long lVar1;
  Status SVar2;
  qint64 qVar3;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype n;
  qint64 size;
  key_type k;
  StreamStateSaver stateSaver;
  mapped_type t;
  QDataStream *in_stack_ffffffffffffff08;
  QDataStream *in_stack_ffffffffffffff10;
  QString *str;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int iVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  StreamStateSaver::StreamStateSaver
            ((StreamStateSaver *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  QHash<QString,_QVariant>::clear((QHash<QString,_QVariant> *)in_stack_ffffffffffffff10);
  qVar3 = QDataStream::readQSizeType(in_stack_ffffffffffffff10);
  if (qVar3 < 0) {
    QDataStream::setStatus(in_RDI,SizeLimitExceeded);
  }
  else {
    for (str = (QString *)0x0; (long)str < qVar3; str = (QString *)((long)&(str->d).d + 1)) {
      QString::QString((QString *)0x3e14f9);
      ::QVariant::QVariant((QVariant *)0x3e1524);
      ::operator>>((QDataStream *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),str)
      ;
      ::operator>>(in_stack_ffffffffffffff10,(QVariant *)in_stack_ffffffffffffff08);
      SVar2 = QDataStream::status(in_RDI);
      if (SVar2 == Ok) {
        QHash<QString,_QVariant>::insert
                  ((QHash<QString,_QVariant> *)in_stack_ffffffffffffff10,
                   (QString *)in_stack_ffffffffffffff08,(QVariant *)0x3e15d2);
        iVar4 = 0;
      }
      else {
        QHash<QString,_QVariant>::clear((QHash<QString,_QVariant> *)in_stack_ffffffffffffff10);
        iVar4 = 2;
      }
      ::QVariant::~QVariant((QVariant *)in_stack_ffffffffffffff10);
      QString::~QString((QString *)0x3e1614);
      if (iVar4 != 0) break;
      in_stack_ffffffffffffff6c = 0;
    }
  }
  StreamStateSaver::~StreamStateSaver((StreamStateSaver *)in_stack_ffffffffffffff10);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readAssociativeContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::key_type k;
        typename Container::mapped_type t;
        s >> k >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.insert(k, t);
    }

    return s;
}